

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

void ctl_arena_refresh(tsdn_t *tsdn,arena_t *arena,ctl_arena_t *ctl_sdarena,uint i,_Bool destroyed)

{
  undefined4 in_ECX;
  ctl_arena_t *in_RDX;
  ctl_arena_t *in_RSI;
  undefined1 in_R8B;
  ctl_arena_t *ctl_arena;
  tsdn_t *in_stack_00000028;
  undefined3 in_stack_ffffffffffffffe0;
  undefined1 destroyed_00;
  
  arenas_i(CONCAT44(in_ECX,CONCAT13(in_R8B,in_stack_ffffffffffffffe0)) & 0xffffffff01ffffff);
  destroyed_00 = (undefined1)((uint)in_ECX >> 0x18);
  ctl_arena_clear((ctl_arena_t *)0x1466f8);
  ctl_arena_stats_amerge(in_stack_00000028,(ctl_arena_t *)tsdn,arena);
  ctl_arena_stats_sdmerge(in_RSI,in_RDX,(_Bool)destroyed_00);
  return;
}

Assistant:

static void
ctl_arena_refresh(tsdn_t *tsdn, arena_t *arena, ctl_arena_t *ctl_sdarena,
    unsigned i, bool destroyed) {
	ctl_arena_t *ctl_arena = arenas_i(i);

	ctl_arena_clear(ctl_arena);
	ctl_arena_stats_amerge(tsdn, ctl_arena, arena);
	/* Merge into sum stats as well. */
	ctl_arena_stats_sdmerge(ctl_sdarena, ctl_arena, destroyed);
}